

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O1

DSA * DSAparams_dup(DSA *x)

{
  DSA *r;
  BIGNUM *pBVar1;
  
  r = DSA_new();
  if (r != (DSA *)0x0) {
    pBVar1 = BN_dup(*(BIGNUM **)x);
    *(BIGNUM **)r = pBVar1;
    pBVar1 = BN_dup((BIGNUM *)x->version);
    r->version = (long)pBVar1;
    pBVar1 = BN_dup(*(BIGNUM **)&x->write_params);
    *(BIGNUM **)&r->write_params = pBVar1;
    if ((*(long *)r != 0) && (pBVar1 != (BIGNUM *)0x0 && r->version != 0)) {
      return r;
    }
    DSA_free(r);
  }
  return (DSA *)0x0;
}

Assistant:

DSA *DSAparams_dup(const DSA *dsa) {
  DSA *ret = DSA_new();
  if (ret == NULL) {
    return NULL;
  }
  ret->p = BN_dup(dsa->p);
  ret->q = BN_dup(dsa->q);
  ret->g = BN_dup(dsa->g);
  if (ret->p == NULL || ret->q == NULL || ret->g == NULL) {
    DSA_free(ret);
    return NULL;
  }
  return ret;
}